

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QConfFile_*>_>::freeData
          (Span<QHashPrivate::Node<QString,_QConfFile_*>_> *this)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  if (*(long *)(this + 0x80) != 0) {
    lVar4 = 0;
    do {
      if (this[lVar4] != (Span<QHashPrivate::Node<QString,_QConfFile_*>_>)0xff) {
        lVar1 = *(long *)(this + 0x80);
        lVar3 = (ulong)(byte)this[lVar4] * 0x20;
        piVar2 = *(int **)(lVar1 + lVar3);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)(lVar1 + lVar3),2,0x10);
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    if (*(void **)(this + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x80));
    }
    *(undefined8 *)(this + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }